

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O1

Territory findMatch(int parentNumber,char *territoryISO)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  __int32_t **pp_Var4;
  undefined8 *puVar5;
  char cVar6;
  Territory TVar7;
  char codeISO [8];
  AlphaRec t;
  undefined2 local_28;
  undefined1 local_26;
  char *local_20 [2];
  
  TVar7 = TERRITORY_NONE;
  if (-1 < parentNumber) {
    if (parentNumber == 0) {
      uVar3 = 0;
    }
    else {
      local_28 = *(undefined2 *)
                  ("?????BDFCGHJKLMNRSTUEPQWYZ?????????A????XV??????????????????????" +
                  (ulong)(uint)parentNumber * 3 + 0x3e);
      local_26 = 0x2d;
      uVar3 = 3;
    }
    do {
      cVar6 = *territoryISO;
      if (cVar6 < '!') goto LAB_001ce97d;
      territoryISO = territoryISO + 1;
      *(char *)((long)&local_28 + uVar3) = cVar6;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 7);
    uVar3 = 7;
LAB_001ce97d:
    if (*territoryISO < '!') {
      *(undefined1 *)((long)&local_28 + (uVar3 & 0xffffffff)) = 0;
      cVar6 = (char)local_28;
      if ((char)local_28 != '\0') {
        pp_Var4 = __ctype_toupper_loc();
        pcVar1 = (char *)&local_28;
        do {
          *pcVar1 = (char)(*pp_Var4)[cVar6];
          cVar6 = pcVar1[1];
          pcVar1 = pcVar1 + 1;
        } while (cVar6 != '\0');
      }
      local_20[0] = (char *)&local_28;
      puVar5 = (undefined8 *)bsearch(local_20,ALPHA_SEARCH,0x394,0x10,compareAlphaCode);
      TVar7 = TERRITORY_NONE;
      if (puVar5 != (undefined8 *)0x0) {
        iVar2 = strcmp(local_20[0],(char *)*puVar5);
        if (iVar2 == 0) {
          TVar7 = *(Territory *)(puVar5 + 1);
        }
      }
    }
  }
  return TVar7;
}

Assistant:

static enum Territory findMatch(const int parentNumber, const char *territoryISO) {
    // build an uppercase search term
    char codeISO[MAX_ISOCODE_ASCII_LEN + 1];
    const char *r = territoryISO;
    int len = 0;
    ASSERT(territoryISO);

    if (parentNumber < 0) {
        return TERRITORY_NONE;
    }
    if (parentNumber > 0) {
        codeISO[0] = PARENTS_2[3 * parentNumber - 3];
        codeISO[1] = PARENTS_2[3 * parentNumber - 2];
        codeISO[2] = '-';
        len = 3;
    }
    while ((len < MAX_ISOCODE_ASCII_LEN) && (*r > 32)) {
        codeISO[len++] = *r++;
    }
    if (*r > 32) {
        return TERRITORY_NONE;
    }
    codeISO[len] = 0;
    makeUppercase(codeISO);
    { // binary-search the result
        const AlphaRec *p;
        AlphaRec t;
        t.alphaCode = codeISO;

        p = (const AlphaRec *) bsearch(&t, ALPHA_SEARCH, NR_TERRITORY_RECS, sizeof(AlphaRec), compareAlphaCode);
        if (p) {
            if (strcmp(t.alphaCode, p->alphaCode) == 0) { // only interested in PERFECT match
                return p->territory;
            } // match
        } // found
    } //
    return TERRITORY_NONE;
}